

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_char,unsigned_char>
          (Thread *this,BinopFunc<unsigned_char,_unsigned_char> *f)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  uchar uVar1;
  uchar *puVar2;
  byte local_49;
  undefined1 auStack_48 [7];
  u8 i;
  SR result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  BinopFunc<unsigned_char,_unsigned_char> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  for (local_49 = 0; local_49 < 0x10; local_49 = local_49 + 1) {
    puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(result.v + 8),local_49);
    uVar1 = *puVar2;
    puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(lhs.v + 8),local_49);
    uVar1 = (*f)(uVar1,*puVar2);
    puVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)auStack_48,local_49);
    *puVar2 = uVar1;
  }
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = auStack_48[0];
  value.v[1] = auStack_48[1];
  value.v[2] = auStack_48[2];
  value.v[3] = auStack_48[3];
  value.v[4] = auStack_48[4];
  value.v[5] = auStack_48[5];
  value.v[6] = auStack_48[6];
  value.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}